

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseDefault(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  Parsekey PVar2;
  int iVar3;
  ObjSense OVar4;
  long lVar5;
  double dVar6;
  bool skip;
  size_t e;
  string sense;
  string strline;
  size_t s;
  string word;
  bool local_a1;
  size_t local_a0;
  string local_98;
  string local_78;
  size_t local_58;
  string local_50;
  
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar1 = getMpsLine(this,file,&local_78,&local_a1);
  PVar2 = kFail;
  if ((!bVar1) || (PVar2 = kComment, local_a1 != false)) goto LAB_001fccf2;
  if (0.0 < this->time_limit_) {
    lVar5 = std::chrono::_V2::system_clock::now();
    dVar6 = (double)lVar5 / 1000000000.0 - this->start_time;
    PVar2 = kTimeout;
    if (this->time_limit_ <= dVar6 && dVar6 != this->time_limit_) goto LAB_001fccf2;
  }
  PVar2 = checkFirstWord(this,&local_78,&local_58,&local_a0,&local_50);
  if (PVar2 != kObjsense) {
    if (PVar2 == kName) {
      if (local_a0 < local_78._M_string_length) {
        first_word(&local_98,&local_78,local_a0);
        std::__cxx11::string::operator=((string *)&this->mps_name,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      PVar2 = kNone;
      highsLogDev(log_options,kInfo,"readMPS: Read NAME    OK\n");
    }
    goto LAB_001fccf2;
  }
  if (local_78._M_string_length <= local_a0) goto LAB_001fccf2;
  first_word(&local_98,&local_78,local_a0);
  toupper((int)&local_98);
  iVar3 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar3 == 0) {
    OVar4 = kMaximize;
LAB_001fce3f:
    this->obj_sense = OVar4;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar3 == 0) {
      OVar4 = kMinimize;
      goto LAB_001fce3f;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
LAB_001fccf2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return PVar2;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseDefault(const HighsLogOptions& log_options,
                                      std::istream& file) {
  std::string strline, word;
  bool skip;
  if (getMpsLine(file, strline, skip)) {
    if (skip) return HMpsFF::Parsekey::kComment;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t s, e;
    HMpsFF::Parsekey key = checkFirstWord(strline, s, e, word);
    if (key == HMpsFF::Parsekey::kName) {
      // Save name of the MPS file
      if (e < strline.length()) {
        mps_name = first_word(strline, e);
      }
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read NAME    OK\n");
      return HMpsFF::Parsekey::kNone;
    }

    if (key == HMpsFF::Parsekey::kObjsense) {
      // Look for Gurobi-style definition of MAX/MIN on OBJSENSE line
      if (e < strline.length()) {
        std::string sense = first_word(strline, e);
        // Convert to upper case
        toupper(sense);
        if (sense.compare("MAX") == 0) {
          // Found MAX sense on OBJSENSE line
          obj_sense = ObjSense::kMaximize;
        } else if (sense.compare("MIN") == 0) {
          // Found MIN sense on OBJSENSE line
          obj_sense = ObjSense::kMinimize;
        }
        // Don't return HMpsFF::Parsekey::kNone; in case there's a
        // redefinition of OBJSENSE on the "proper" line. If there's
        // no such line, the ROWS keyword is read OK
      }
    }

    return key;
  }
  return HMpsFF::Parsekey::kFail;
}